

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionOffer.cpp
# Opt level: O2

void __thiscall ki::protocol::control::SessionOffer::read_from(SessionOffer *this,istream *istream)

{
  Field<unsigned_short> *pFVar1;
  Field<int> *pFVar2;
  Field<unsigned_int> *pFVar3;
  string sStack_298;
  string local_278;
  string local_258;
  string local_238;
  Record record;
  ostringstream oss;
  
  ki::dml::Record::Record(&record);
  std::__cxx11::string::string((string *)&local_238,"m_session_id",(allocator *)&oss);
  pFVar1 = ki::dml::Record::add_field<unsigned_short>(&record,&local_238,true);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::string((string *)&local_258,"unknown",(allocator *)&oss);
  ki::dml::Record::add_field<unsigned_int>(&record,&local_258,true);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::string((string *)&local_278,"m_timestamp",(allocator *)&oss);
  pFVar2 = ki::dml::Record::add_field<int>(&record,&local_278,true);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::string((string *)&sStack_298,"m_milliseconds",(allocator *)&oss);
  pFVar3 = ki::dml::Record::add_field<unsigned_int>(&record,&sStack_298,true);
  std::__cxx11::string::~string((string *)&sStack_298);
  ki::dml::Record::read_from(&record,istream);
  this->m_session_id = pFVar1->m_value;
  this->m_timestamp = pFVar2->m_value;
  this->m_milliseconds = pFVar3->m_value;
  ki::dml::Record::~Record(&record);
  return;
}

Assistant:

void SessionOffer::read_from(std::istream& istream)
	{
		dml::Record record;
		auto *session_id = record.add_field<dml::USHRT>("m_session_id");
		record.add_field<dml::UINT>("unknown");
		auto *timestamp = record.add_field<dml::INT>("m_timestamp");
		auto *milliseconds = record.add_field<dml::UINT>("m_milliseconds");
		try
		{
			record.read_from(istream);
		}
		catch (dml::parse_error &e)
		{
			std::ostringstream oss;
			oss << "Error reading SessionOffer payload: " << e.what();
			throw parse_error(oss.str(), parse_error::INVALID_MESSAGE_DATA);
		}

		m_session_id = session_id->get_value();
		m_timestamp = timestamp->get_value();
		m_milliseconds = milliseconds->get_value();
	}